

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

lhcell * lhFindCell(lhpage *pPage,void *pKey,sxu32 nByte,sxu32 nHash)

{
  int iVar1;
  sxi32 sVar2;
  void *pvStack_48;
  int rc;
  lhash_key_cmp sCmp;
  lhcell *pEntry;
  sxu32 nHash_local;
  sxu32 nByte_local;
  void *pKey_local;
  lhpage *pPage_local;
  
  if (pPage->nCell != 0) {
    for (sCmp.xCmp = (ProcCmp)pPage->apCell[nHash & pPage->nCellSize - 1]; sCmp.xCmp != (ProcCmp)0x0
        ; sCmp.xCmp = *(ProcCmp *)(sCmp.xCmp + 0x70)) {
      if ((*(sxu32 *)sCmp.xCmp == nHash) && (*(sxu32 *)(sCmp.xCmp + 4) == nByte)) {
        if (*(int *)(sCmp.xCmp + 0x50) == 0) {
          sCmp.zIn = (char *)((long)pKey + (ulong)nByte);
          sCmp.zEnd = (char *)pPage->pHash->xCmp;
          pvStack_48 = pKey;
          iVar1 = lhConsumeCellkey((lhcell *)sCmp.xCmp,lhKeyCmp,&stack0xffffffffffffffb8,0);
          if (iVar1 == 0) {
            return (lhcell *)sCmp.xCmp;
          }
        }
        else {
          sVar2 = (*pPage->pHash->xCmp)(pKey,*(void **)(sCmp.xCmp + 0x48),nByte);
          if (sVar2 == 0) {
            return (lhcell *)sCmp.xCmp;
          }
        }
      }
    }
  }
  return (lhcell *)0x0;
}

Assistant:

static lhcell * lhFindCell(
	lhpage *pPage,    /* Target page */
	const void *pKey, /* Lookup key */
	sxu32 nByte,      /* Key length */
	sxu32 nHash       /* Hash of the key */
	)
{
	lhcell *pEntry;
	if( pPage->nCell < 1 ){
		/* Don't bother hashing */
		return 0;
	}
	/* Point to the corresponding bucket */
	pEntry = pPage->apCell[nHash & (pPage->nCellSize - 1)];
	for(;;){
		if( pEntry == 0 ){
			break;
		}
		if( pEntry->nHash == nHash && pEntry->nKey == nByte ){
			if( SyBlobLength(&pEntry->sKey) < 1 ){
				/* Large key (> 256 KB) are not kept in-memory */
				struct lhash_key_cmp sCmp;
				int rc;
				/* Fill-in the structure */
				sCmp.zIn = (const char *)pKey;
				sCmp.zEnd = &sCmp.zIn[nByte];
				sCmp.xCmp = pPage->pHash->xCmp;
				/* Fetch the key from disk and perform the comparison */
				rc = lhConsumeCellkey(pEntry,lhKeyCmp,&sCmp,0);
				if( rc == UNQLITE_OK ){
					/* Cell found */
					return pEntry;
				}
			}else if ( pPage->pHash->xCmp(pKey,SyBlobData(&pEntry->sKey),nByte) == 0 ){
				/* Cell found */
				return pEntry;
			}
		}
		/* Point to the next entry */
		pEntry = pEntry->pNextCol;
	}
	/* No such entry */
	return 0;
}